

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex.h
# Opt level: O3

void __thiscall
Gudhi::cubical_complex::
Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
initialize_filtration
          (Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
           *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  end;
  undefined1 auVar1 [16];
  ulong uVar2;
  unsigned_long uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> local_10;
  long lVar6;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->sorted_cells,
             (long)(this->super_Bitmap_cubical_complex_base<double>).data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->super_Bitmap_cubical_complex_base<double>).data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  auVar1 = _DAT_00124040;
  begin._M_current =
       (this->sorted_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  end._M_current =
       (this->sorted_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (begin._M_current != end._M_current) {
    uVar2 = (long)end._M_current + (-8 - (long)begin._M_current);
    auVar7._8_4_ = (int)uVar2;
    auVar7._0_8_ = uVar2;
    auVar7._12_4_ = (int)(uVar2 >> 0x20);
    auVar4._0_8_ = uVar2 >> 3;
    auVar4._8_8_ = auVar7._8_8_ >> 3;
    uVar3 = 0;
    auVar4 = auVar4 ^ _DAT_00124040;
    auVar5 = _DAT_00124030;
    do {
      auVar7 = auVar5 ^ auVar1;
      if ((bool)(~(auVar7._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar7._0_4_ ||
                  auVar4._4_4_ < auVar7._4_4_) & 1)) {
        begin._M_current[uVar3] = uVar3;
      }
      if ((auVar7._12_4_ != auVar4._12_4_ || auVar7._8_4_ <= auVar4._8_4_) &&
          auVar7._12_4_ <= auVar4._12_4_) {
        begin._M_current[uVar3 + 1] = uVar3 + 1;
      }
      uVar3 = uVar3 + 2;
      lVar6 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar6 + 2;
    } while (((uVar2 >> 3) + 2 & 0xfffffffffffffffe) != uVar3);
  }
  local_10.CC_ = this;
  tbb::detail::d1::
  parallel_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Gudhi::cubical_complex::is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>>>
            (begin,end,&local_10);
  return;
}

Assistant:

void Bitmap_cubical_complex<T>::initialize_filtration() {
#ifdef DEBUG_TRACES
  std::clog << "void Bitmap_cubical_complex<T>::initialize_elements_ordered_according_to_filtration() \n";
#endif
  this->sorted_cells.resize(this->data.size());
  std::iota(std::begin(sorted_cells), std::end(sorted_cells), 0);
#ifdef GUDHI_USE_TBB
  tbb::parallel_sort(sorted_cells.begin(), sorted_cells.end(),
                     is_before_in_filtration<T>(this));
#else
  std::sort(sorted_cells.begin(), sorted_cells.end(), is_before_in_filtration<T>(this));
#endif
}